

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

string * __thiscall
google::LogSink::ToString_abi_cxx11_
          (string *__return_storage_ptr__,LogSink *this,LogSeverity severity,char *file,int line,
          LogMessageTime *logmsgtime,char *message,size_t message_len)

{
  long lVar1;
  int *piVar2;
  long *this_00;
  ostream *poVar3;
  id __id;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  undefined4 in_register_00000014;
  undefined4 in_register_00000084;
  ostringstream stream;
  undefined8 auStack_198 [26];
  undefined1 auStack_c8 [152];
  
  piVar2 = (int *)CONCAT44(in_register_00000084,line);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stream);
  lVar1 = *(long *)(_stream + -0x18);
  std::ios::fill();
  auStack_c8[lVar1] = 0x30;
  std::operator<<((ostream *)&stream,**(char **)(LogSeverityNames + ((ulong)this & 0xffffffff) * 8))
  ;
  if (fLB::FLAGS_log_year_in_prefix == '\x01') {
    *(undefined8 *)((long)auStack_198 + *(long *)(_stream + -0x18)) = 4;
    std::ostream::operator<<(&stream,piVar2[5] + 0x76c);
  }
  *(undefined8 *)((long)auStack_198 + *(long *)(_stream + -0x18)) = 2;
  this_00 = (long *)std::ostream::operator<<(&stream,piVar2[4] + 1);
  *(undefined8 *)((long)this_00 + *(long *)(*this_00 + -0x18) + 0x10) = 2;
  poVar3 = (ostream *)std::ostream::operator<<(this_00,piVar2[3]);
  poVar3 = std::operator<<(poVar3,' ');
  *(undefined8 *)(&poVar3->field_0x10 + (long)poVar3->_vptr_basic_ostream[-3]) = 2;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,piVar2[2]);
  poVar3 = std::operator<<(poVar3,':');
  *(undefined8 *)(&poVar3->field_0x10 + (long)poVar3->_vptr_basic_ostream[-3]) = 2;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,piVar2[1]);
  poVar3 = std::operator<<(poVar3,':');
  *(undefined8 *)(&poVar3->field_0x10 + (long)poVar3->_vptr_basic_ostream[-3]) = 2;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar2);
  poVar3 = std::operator<<(poVar3,'.');
  *(undefined8 *)(&poVar3->field_0x10 + (long)poVar3->_vptr_basic_ostream[-3]) = 6;
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  poVar3 = std::operator<<(poVar3,' ');
  poVar3 = std::operator<<(poVar3,0x20);
  *(undefined8 *)(&poVar3->field_0x10 + (long)poVar3->_vptr_basic_ostream[-3]) = 5;
  __id._M_thread = pthread_self();
  pbVar4 = std::operator<<(poVar3,__id);
  poVar3 = std::operator<<(pbVar4,0x30);
  poVar3 = std::operator<<(poVar3,' ');
  poVar3 = std::operator<<(poVar3,(char *)CONCAT44(in_register_00000014,severity));
  poVar3 = std::operator<<(poVar3,':');
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)file);
  std::operator<<(poVar3,"] ");
  std::ostream::write((char *)&stream,(long)logmsgtime);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stream);
  return __return_storage_ptr__;
}

Assistant:

string LogSink::ToString(LogSeverity severity, const char* file, int line,
                         const LogMessageTime& logmsgtime, const char* message,
                         size_t message_len) {
  ostringstream stream;
  stream.fill('0');

  stream << LogSeverityNames[severity][0];
  if (FLAGS_log_year_in_prefix) {
    stream << setw(4) << 1900 + logmsgtime.year();
  }
  stream << setw(2) << 1 + logmsgtime.month() << setw(2) << logmsgtime.day()
         << ' ' << setw(2) << logmsgtime.hour() << ':' << setw(2)
         << logmsgtime.min() << ':' << setw(2) << logmsgtime.sec() << '.'
         << setw(6) << logmsgtime.usec() << ' ' << setfill(' ') << setw(5)
         << std::this_thread::get_id() << setfill('0') << ' ' << file << ':'
         << line << "] ";

  // A call to `write' is enclosed in parenthneses to prevent possible macro
  // expansion.  On Windows, `write' could be a macro defined for portability.
  (stream.write)(message, static_cast<std::streamsize>(message_len));
  return stream.str();
}